

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void check_trap(wasm_func_t *func,int32_t arg1,int32_t arg2)

{
  long lVar1;
  wasm_trap_t *trap;
  wasm_val_t args [2];
  int32_t arg2_local;
  int32_t arg1_local;
  wasm_func_t *func_local;
  
  trap._0_1_ = 0;
  args[0].of.i32._0_1_ = 0;
  args[0]._0_4_ = arg1;
  args[1]._0_4_ = arg2;
  args[1].of._0_4_ = arg2;
  args[1].of._4_4_ = arg1;
  lVar1 = wasm_func_call(func,&trap,0);
  if (lVar1 == 0) {
    printf("> Error on result, expected trap\n");
    exit(1);
  }
  wasm_trap_delete(lVar1);
  return;
}

Assistant:

void check_trap(wasm_func_t* func, int32_t arg1, int32_t arg2) {
  wasm_val_t args[2] = {
    {.kind = WASM_I32, .of = {.i32 = arg1}},
    {.kind = WASM_I32, .of = {.i32 = arg2}}
  };
  own wasm_trap_t* trap = wasm_func_call(func, args, NULL);
  if (! trap) {
    printf("> Error on result, expected trap\n");
    exit(1);
  }
  wasm_trap_delete(trap);
}